

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion
          (CollationDataBuilder *this,int64_t *ces,int32_t length,UErrorCode *errorCode)

{
  int iVar1;
  int64_t *piVar2;
  UBool UVar3;
  uint uVar4;
  int iVar5;
  int64_t *piVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar1 = (this->ce64s).count;
  if (length <= iVar1) {
    piVar2 = (this->ce64s).elements;
    uVar9 = 0;
    piVar6 = piVar2;
    do {
      if ((long)uVar9 < (long)iVar1) {
        iVar7 = piVar2[uVar9];
      }
      else {
        iVar7 = 0;
      }
      if (*ces == iVar7) {
        if (0x7ffff < uVar9) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          return 0;
        }
        if (length == 1) {
LAB_002426ef:
          return length << 8 | (int)uVar9 << 0xd | 0xc6;
        }
        uVar8 = 1;
        while( true ) {
          if ((int)uVar9 + (int)uVar8 < iVar1) {
            iVar7 = piVar6[uVar8];
          }
          else {
            iVar7 = 0;
          }
          if (iVar7 != ces[uVar8]) break;
          uVar8 = uVar8 + 1;
          if ((uint)length == uVar8) goto LAB_002426ef;
        }
      }
      uVar9 = uVar9 + 1;
      piVar6 = piVar6 + 1;
    } while (uVar9 != (iVar1 - length) + 1);
  }
  if (iVar1 < 0x80000) {
    if (0 < length) {
      uVar9 = 0;
      do {
        iVar7 = ces[uVar9];
        iVar5 = (this->ce64s).count;
        if ((iVar5 < -1) || ((this->ce64s).capacity <= iVar5)) {
          UVar3 = UVector64::expandCapacity(&this->ce64s,iVar5 + 1,errorCode);
          if (UVar3 != '\0') {
            iVar5 = (this->ce64s).count;
            goto LAB_0024274f;
          }
        }
        else {
LAB_0024274f:
          (this->ce64s).elements[iVar5] = iVar7;
          (this->ce64s).count = iVar5 + 1;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)length != uVar9);
    }
    uVar4 = length << 8 | iVar1 << 0xd | 0xc6;
  }
  else {
    *errorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return uVar4;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion(const int64_t ces[], int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CEs has already been stored.
    int64_t first = ces[0];
    int32_t ce64sMax = ce64s.size() - length;
    for(int32_t i = 0; i <= ce64sMax; ++i) {
        if(first == ce64s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION_TAG, i, length);
                }
                if(ce64s.elementAti(i + j) != ces[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce64s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce64s.addElement(ces[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION_TAG, i, length);
}